

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O3

void __thiscall QCompleterPrivate::showPopup(QCompleterPrivate *this,QRect *rect)

{
  uint uVar1;
  uint uVar2;
  QWidget *pQVar3;
  QWidgetData *pQVar4;
  long lVar5;
  LayoutDirection LVar6;
  int iVar7;
  int iVar8;
  Representation RVar9;
  QAbstractItemModel *pQVar10;
  QScrollBar *pQVar11;
  int extraout_var;
  QPoint QVar12;
  QSize QVar13;
  int iVar14;
  int iVar15;
  Representation RVar16;
  QWidget *this_00;
  int iVar17;
  Representation RVar18;
  long in_FS_OFFSET;
  undefined1 auVar19 [16];
  int local_5c;
  QRect local_50;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::screen((QWidget *)(this->widget).wp.value);
  auVar19 = QScreen::availableGeometry();
  LVar6 = QWidget::layoutDirection((QWidget *)(this->widget).wp.value);
  iVar7 = (**(code **)(*(long *)&(this->popup->super_QAbstractScrollArea).super_QFrame.super_QWidget
                      + 0x1f8))(this->popup,0);
  pQVar10 = QAbstractItemView::model((QAbstractItemView *)this->popup);
  local_50.x1.m_i = -1;
  local_50.y1.m_i = -1;
  local_50.x2.m_i = 0;
  local_50.y2.m_i = 0;
  uStack_40 = 0;
  iVar8 = (**(code **)(*(long *)pQVar10 + 0x78))(pQVar10);
  if (this->maxVisibleItems < iVar8) {
    iVar8 = this->maxVisibleItems;
  }
  iVar8 = iVar8 * iVar7 + 6;
  pQVar11 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this->popup);
  if ((pQVar11 != (QScrollBar *)0x0) &&
     ((((pQVar11->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) != 0)) {
    pQVar11 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this->popup);
    (**(code **)(*(long *)&(pQVar11->super_QAbstractSlider).super_QWidget + 0x70))();
    iVar8 = iVar8 + extraout_var;
  }
  iVar7 = (rect->x1).m_i;
  local_5c = (rect->y1).m_i;
  iVar17 = (rect->x2).m_i;
  uVar1 = (rect->y2).m_i;
  if ((int)uVar1 < local_5c || iVar17 < iVar7) {
    pQVar3 = (QWidget *)(this->widget).wp.value;
    pQVar4 = pQVar3->data;
    uVar1 = (pQVar4->crect).y1.m_i;
    uVar2 = (pQVar4->crect).y2.m_i;
    local_5c = ~uVar2 + uVar1;
    this_00 = (QWidget *)0x0;
    if (*(int *)((this->widget).wp.d + 4) != 0) {
      this_00 = pQVar3;
    }
    local_50._0_8_ = (ulong)(~uVar1 + uVar2) << 0x20;
    QVar12 = QWidget::mapToGlobal(this_00,(QPoint *)&local_50);
    lVar5 = *(long *)((this->widget).wp.value + 0x20);
    iVar17 = *(int *)(lVar5 + 0x1c) - *(int *)(lVar5 + 0x14);
  }
  else {
    iVar17 = iVar17 - iVar7;
    if (LVar6 == RightToLeft) {
      local_50.x1.m_i = (rect->x2).m_i;
      local_50.y1.m_i = (rect->y2).m_i;
    }
    else {
      local_50._0_8_ = CONCAT44(uVar1,iVar7);
    }
    local_5c = local_5c + ~uVar1;
    QVar12 = QWidget::mapToGlobal((QWidget *)(this->widget).wp.value,(QPoint *)&local_50);
  }
  RVar16.m_i = (int)QVar12.yp.m_i;
  iVar14 = auVar19._8_4_ + 1;
  iVar15 = auVar19._0_4_;
  iVar7 = iVar14 - iVar15;
  if (iVar17 + 1 < iVar14 - iVar15) {
    iVar7 = iVar17 + 1;
  }
  RVar18.m_i = iVar14 - iVar7;
  if (QVar12.xp.m_i.m_i + iVar7 <= iVar14) {
    RVar18.m_i = QVar12.xp.m_i.m_i;
  }
  if (RVar18.m_i <= iVar15) {
    RVar18.m_i = iVar15;
  }
  iVar17 = auVar19._12_4_ - RVar16.m_i;
  QVar13 = QWidget::minimumSize((QWidget *)this->popup);
  RVar9.m_i = QVar13.ht.m_i.m_i;
  if (QVar13.ht.m_i.m_i < iVar8) {
    RVar9.m_i = iVar8;
  }
  if (iVar17 < RVar9.m_i) {
    iVar14 = (local_5c - auVar19._4_4_) + RVar16.m_i + 2;
    iVar8 = iVar17;
    if (iVar17 < iVar14) {
      iVar8 = iVar14;
    }
    if (RVar9.m_i <= iVar8) {
      iVar8 = RVar9.m_i;
    }
    RVar9.m_i = iVar8;
    if (iVar17 < iVar14) {
      RVar16.m_i = ((local_5c + RVar16.m_i) - iVar8) + 2;
    }
  }
  local_50.y1.m_i = RVar16.m_i;
  local_50.x1.m_i = RVar18.m_i;
  local_50.y2.m_i = RVar9.m_i + RVar16.m_i + -1;
  local_50.x2.m_i = iVar7 + -1 + RVar18.m_i;
  QWidget::setGeometry((QWidget *)this->popup,&local_50);
  if ((((QWidget *)this->popup)->data->widget_attributes & 0x8000) == 0) {
    QWidget::show((QWidget *)this->popup);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCompleterPrivate::showPopup(const QRect& rect)
{
    const QRect screen = widget->screen()->availableGeometry();
    Qt::LayoutDirection dir = widget->layoutDirection();
    QPoint pos;
    int rh, w;
    int h = (popup->sizeHintForRow(0) * qMin(maxVisibleItems, popup->model()->rowCount()) + 3) + 3;
    QScrollBar *hsb = popup->horizontalScrollBar();
    if (hsb && hsb->isVisible())
        h += popup->horizontalScrollBar()->sizeHint().height();

    if (rect.isValid()) {
        rh = rect.height();
        w = rect.width();
        pos = widget->mapToGlobal(dir == Qt::RightToLeft ? rect.bottomRight() : rect.bottomLeft());
    } else {
        rh = widget->height();
        pos = widget->mapToGlobal(QPoint(0, widget->height() - 2));
        w = widget->width();
    }

    if (w > screen.width())
        w = screen.width();
    if ((pos.x() + w) > (screen.x() + screen.width()))
        pos.setX(screen.x() + screen.width() - w);
    if (pos.x() < screen.x())
        pos.setX(screen.x());

    int top = pos.y() - rh - screen.top() + 2;
    int bottom = screen.bottom() - pos.y();
    h = qMax(h, popup->minimumHeight());
    if (h > bottom) {
        h = qMin(qMax(top, bottom), h);

        if (top > bottom)
            pos.setY(pos.y() - h - rh + 2);
    }

    popup->setGeometry(pos.x(), pos.y(), w, h);

    if (!popup->isVisible())
        popup->show();
}